

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

void NULLCMemory::read_into_double_array(NULLCArray buffer,int offset,NULLCArray result)

{
  uint uVar1;
  char *error;
  uint uVar2;
  
  uVar2 = result.len;
  if ((result.ptr == (char *)0x0) || (buffer.ptr == (char *)0x0)) {
    error = "buffer is empty";
  }
  else if (offset < 0) {
    error = "offset is negative";
  }
  else if ((int)uVar2 < 0) {
    error = "element count is negative";
  }
  else {
    error = "buffer overflow";
    uVar1 = buffer.len - offset;
    if (((uint)offset <= buffer.len && uVar1 != 0) && (uVar2 <= uVar1 >> 3)) {
      memcpy(result.ptr,buffer.ptr + (uint)offset,(ulong)uVar2 << 3);
      return;
    }
  }
  nullcThrowError(error);
  return;
}

Assistant:

void read_into_double_array(NULLCArray buffer, int offset, NULLCArray result)
	{
		if(!result.ptr)
		{
			nullcThrowError("buffer is empty");
			return;
		}

		if(!check_access(buffer, offset, 3, result.len))
			return;

		memcpy(result.ptr, buffer.ptr + offset, sizeof(double) * result.len);
	}